

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

string * duckdb::CastExceptionText<duckdb::string_t,duckdb::uhugeint_t>(string_t input)

{
  string_t input_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  PhysicalType in_stack_0000001f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_b8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  input_00.value.pointer.ptr = (char *)in_RDI;
  input_00.value._0_8_ = in_RDI;
  __lhs = in_RDI;
  ConvertToString::Operation<duckdb::string_t>(input_00);
  ::std::operator+((char *)__lhs,in_RDI);
  ::std::operator+(__lhs,(char *)in_RDI);
  GetTypeId<duckdb::uhugeint_t>();
  TypeIdToString_abi_cxx11_(in_stack_0000001f);
  ::std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  ::std::__cxx11::string::~string(local_b8);
  ::std::__cxx11::string::~string(local_38);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_78);
  return (string *)__lhs;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}